

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O0

void test_send_impl(char *file,int line,int sock,char *data)

{
  FILE *__stream;
  uint uVar1;
  size_t sVar2;
  int *piVar3;
  char *pcVar4;
  uint *puVar5;
  int rc;
  size_t data_len;
  char *data_local;
  int sock_local;
  int line_local;
  char *file_local;
  
  sVar2 = strlen(data);
  uVar1 = nn_send(sock,data,sVar2,0);
  __stream = _stderr;
  if ((int)uVar1 < 0) {
    piVar3 = __errno_location();
    pcVar4 = nn_err_strerror(*piVar3);
    puVar5 = (uint *)__errno_location();
    fprintf(__stream,"Failed to send: %s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,file,
            (ulong)(uint)line);
    nn_err_abort();
  }
  if (uVar1 != (uint)sVar2) {
    fprintf(_stderr,"Data to send is truncated: %d != %d (%s:%d)\n",(ulong)uVar1,sVar2 & 0xffffffff,
            file,(ulong)(uint)line);
    nn_err_abort();
  }
  return;
}

Assistant:

static void NN_UNUSED test_send_impl (char *file, int line,
    int sock, char *data)
{
    size_t data_len;
    int rc;

    data_len = strlen (data);

    rc = nn_send (sock, data, data_len, 0);
    if (rc < 0) {
        fprintf (stderr, "Failed to send: %s [%d] (%s:%d)\n",
            nn_err_strerror (errno),
            (int) errno, file, line);
        nn_err_abort ();
    }
    if (rc != (int)data_len) {
        fprintf (stderr, "Data to send is truncated: %d != %d (%s:%d)\n",
            rc, (int) data_len,
            file, line);
        nn_err_abort ();
    }
}